

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirichlet.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
despot::Dirichlet::Next
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *alpha)

{
  pointer pdVar1;
  int iVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  double dVar5;
  allocator_type local_31;
  double local_30;
  value_type_conflict3 local_28;
  
  uVar3 = (ulong)((long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar2 = (int)uVar3;
  local_28 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)iVar2,&local_28,&local_31);
  uVar4 = 0;
  uVar3 = uVar3 & 0xffffffff;
  if (iVar2 < 1) {
    uVar3 = uVar4;
  }
  local_30 = 0.0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar5 = Gamma::Next((alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar4],1.0);
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar4] = dVar5;
    local_30 = local_30 + dVar5;
  }
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pdVar1[uVar4] = pdVar1[uVar4] / local_30;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> Dirichlet::Next(vector<double> alpha) {
	int dim = alpha.size();
	vector<double> x(dim, 0);
	double sum = 0;
	for (int i = 0; i < dim; i++) {
		x[i] = Gamma::Next(alpha[i], 1);
		sum = sum + x[i];
	}
	for (int i = 0; i < dim; i++)
		x[i] = x[i] / sum;
	return x;
}